

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Bot.cpp
# Opt level: O3

string * __thiscall
IRC_Bot::getTriggers_abi_cxx11_
          (string *__return_storage_ptr__,IRC_Bot *this,
          vector<IRCCommand_*,_std::allocator<IRCCommand_*>_> *commands)

{
  ulong *puVar1;
  IRCCommand **command;
  ulong *puVar2;
  undefined1 auVar3 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(ulong **)&this->field_0x8;
  for (puVar2 = *(ulong **)this; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    auVar3 = Jupiter::Command::getTrigger(*puVar2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,auVar3._8_8_,auVar3._0_8_);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,' ');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IRC_Bot::getTriggers(std::vector<IRCCommand*> &commands) {
	std::string result;
	for (const auto& command : commands) {
		result += command->getTrigger();
		result += ' ';
	}

	return result;
}